

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)

{
  LIBSSH2_SESSION *pLVar1;
  libssh2_nonblocking_states lVar2;
  int iVar3;
  time_t tVar4;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  lVar2 = channel->req_auth_agent_try_state;
  if (lVar2 == libssh2_NB_state_idle) {
    tVar4 = time((time_t *)0x0);
    do {
      iVar3 = channel_request_auth_agent(channel,"auth-agent-req@openssh.com",0x1a);
      if (iVar3 != -0x25) break;
      pLVar1 = channel->session;
      iVar3 = -0x25;
      if ((pLVar1 == (LIBSSH2_SESSION *)0x0) || (pLVar1->api_block_mode == 0)) goto LAB_001104e6;
      iVar3 = _libssh2_wait_socket(pLVar1,tVar4);
    } while (iVar3 == 0);
    if ((iVar3 == -0x25) || (iVar3 == 0)) {
LAB_001104e6:
      lVar2 = channel->req_auth_agent_try_state;
      goto LAB_001104ec;
    }
    channel->req_auth_agent_try_state = libssh2_NB_state_sent;
LAB_001104f1:
    tVar4 = time((time_t *)0x0);
    do {
      iVar3 = channel_request_auth_agent(channel,"auth-agent-req",0xe);
      if (iVar3 != -0x25) break;
      pLVar1 = channel->session;
      if (pLVar1 == (LIBSSH2_SESSION *)0x0) {
        return -0x25;
      }
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar1,tVar4);
    } while (iVar3 == 0);
    if ((iVar3 != 0) && (iVar3 != -0x25)) {
      lVar2 = libssh2_NB_state_sent1;
      goto LAB_00110552;
    }
  }
  else {
    iVar3 = -0x17;
LAB_001104ec:
    if (lVar2 == libssh2_NB_state_sent) goto LAB_001104f1;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  lVar2 = libssh2_NB_state_idle;
  iVar3 = 0;
LAB_00110552:
  channel->req_auth_agent_try_state = lVar2;
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    rc = LIBSSH2_ERROR_CHANNEL_UNKNOWN;

    /* The current RFC draft for agent forwarding says you're supposed to
     * send "auth-agent-req," but most SSH servers out there right now
     * actually expect "auth-agent-req@openssh.com", so we try that
     * first. */
    if(channel->req_auth_agent_try_state == libssh2_NB_state_idle) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req@openssh.com",
                                                26));

        /* If we failed (but not with EAGAIN), then we move onto
         * the next step to try another request type. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent;
    }

    if(channel->req_auth_agent_try_state == libssh2_NB_state_sent) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req", 14));

        /* If we failed without an EAGAIN, then move on with this
         * state machine. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent1;
    }

    /* If things are good, reset the try state. */
    if(rc == LIBSSH2_ERROR_NONE)
        channel->req_auth_agent_try_state = libssh2_NB_state_idle;

    return rc;
}